

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

TIFFReadDirEntryErr TIFFReadDirEntryCheckedRational(TIFF *tif,TIFFDirEntry *direntry,double *value)

{
  TIFFReadDirEntryErr TVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  UInt64Aligned_t m;
  uint32_t offset;
  undefined8 local_28;
  uint32_t local_1c;
  
  uVar2 = tif->tif_flags;
  if ((uVar2 >> 0x13 & 1) == 0) {
    local_1c = (direntry->tdir_offset).toff_long;
    if ((char)uVar2 < '\0') {
      TIFFSwabLong(&local_1c);
    }
    TVar1 = TIFFReadDirEntryData(tif,(ulong)local_1c,8,&local_28);
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    uVar2 = tif->tif_flags;
  }
  else {
    local_28 = (direntry->tdir_offset).toff_long8;
  }
  if ((char)uVar2 < '\0') {
    TIFFSwabArrayOfLong((uint32_t *)&local_28,2);
  }
  dVar4 = 0.0;
  if (local_28._4_4_ != 0) {
    dVar4 = (double)(local_28 & 0xffffffff) / (double)local_28._4_4_;
  }
  dVar3 = 0.0;
  if ((uint32_t)local_28 != 0) {
    dVar3 = dVar4;
  }
  *value = dVar3;
  return TIFFReadDirEntryErrOk;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryCheckedRational(TIFF *tif, TIFFDirEntry *direntry,
                                double *value)
{
    UInt64Aligned_t m;

    assert(sizeof(double) == 8);
    assert(sizeof(uint64_t) == 8);
    assert(sizeof(uint32_t) == 4);
    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        enum TIFFReadDirEntryErr err;
        uint32_t offset = direntry->tdir_offset.toff_long;
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabLong(&offset);
        err = TIFFReadDirEntryData(tif, offset, 8, m.i);
        if (err != TIFFReadDirEntryErrOk)
            return (err);
    }
    else
        m.l = direntry->tdir_offset.toff_long8;
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabArrayOfLong(m.i, 2);
    /* Not completely sure what we should do when m.i[1]==0, but some */
    /* sanitizers do not like division by 0.0: */
    /* http://bugzilla.maptools.org/show_bug.cgi?id=2644 */
    if (m.i[0] == 0 || m.i[1] == 0)
        *value = 0.0;
    else
        *value = (double)m.i[0] / (double)m.i[1];
    return (TIFFReadDirEntryErrOk);
}